

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool parse_string(cJSON *item,parse_buffer *input_buffer)

{
  _func_void_ptr_size_t *p_Var1;
  bool bVar2;
  byte local_51;
  long lStack_50;
  uchar sequence_length;
  size_t skipped_bytes;
  size_t allocation_length;
  uchar *output;
  uchar *output_pointer;
  uchar *input_end;
  uchar *input_pointer;
  parse_buffer *input_buffer_local;
  cJSON *item_local;
  
  input_end = input_buffer->content + input_buffer->offset + 1;
  output_pointer = input_buffer->content + input_buffer->offset + 1;
  output = (uchar *)0x0;
  allocation_length = 0;
  input_pointer = (uchar *)input_buffer;
  input_buffer_local = (parse_buffer *)item;
  if (input_buffer->content[input_buffer->offset] == '\"') {
    lStack_50 = 0;
    while( true ) {
      bVar2 = false;
      if ((ulong)((long)output_pointer - (long)input_buffer->content) < input_buffer->length) {
        bVar2 = *output_pointer != '\"';
      }
      if (!bVar2) break;
      if (*output_pointer == '\\') {
        if ((uchar *)input_buffer->length <= output_pointer + (1 - (long)input_buffer->content))
        goto LAB_00106569;
        lStack_50 = lStack_50 + 1;
        output_pointer = output_pointer + 1;
      }
      output_pointer = output_pointer + 1;
    }
    if ((((ulong)((long)output_pointer - (long)input_buffer->content) < input_buffer->length) &&
        (*output_pointer == '\"')) &&
       (allocation_length =
             (size_t)(*(input_buffer->hooks).allocate)
                               ((size_t)(output_pointer +
                                        (-lStack_50 -
                                        (long)(input_buffer->content + input_buffer->offset)) + 1)),
       p_Var1 = (_func_void_ptr_size_t *)allocation_length,
       (_func_void_ptr_size_t *)allocation_length != (_func_void_ptr_size_t *)0x0)) {
      do {
        while( true ) {
          output = (uchar *)p_Var1;
          if (output_pointer <= input_end) {
            *output = '\0';
            *(undefined4 *)&input_buffer_local->depth = 0x10;
            (input_buffer_local->hooks).allocate = (_func_void_ptr_size_t *)allocation_length;
            *(long *)(input_pointer + 0x10) = (long)output_pointer - *(long *)input_pointer;
            *(long *)(input_pointer + 0x10) = *(long *)(input_pointer + 0x10) + 1;
            return 1;
          }
          if (*input_end == '\\') break;
          *output = *input_end;
          p_Var1 = (_func_void_ptr_size_t *)(output + 1);
          input_end = input_end + 1;
        }
        local_51 = 2;
        if ((long)output_pointer - (long)input_end < 1) break;
        switch(input_end[1]) {
        case '\"':
        case '/':
        case '\\':
          *output = input_end[1];
          output = output + 1;
          break;
        default:
          goto LAB_00106569;
        case 'b':
          *output = '\b';
          output = output + 1;
          break;
        case 'f':
          *output = '\f';
          output = output + 1;
          break;
        case 'n':
          *output = '\n';
          output = output + 1;
          break;
        case 'r':
          *output = '\r';
          output = output + 1;
          break;
        case 't':
          *output = '\t';
          output = output + 1;
          break;
        case 'u':
          local_51 = utf16_literal_to_utf8(input_end,output_pointer,&output);
          if (local_51 == 0) goto LAB_00106569;
        }
        input_end = input_end + (int)(uint)local_51;
        p_Var1 = (_func_void_ptr_size_t *)output;
      } while( true );
    }
  }
LAB_00106569:
  if (allocation_length != 0) {
    (**(code **)(input_pointer + 0x28))(allocation_length);
  }
  if (input_end != (uchar *)0x0) {
    *(long *)(input_pointer + 0x10) = (long)input_end - *(long *)input_pointer;
  }
  return 0;
}

Assistant:

static cJSON_bool parse_string(cJSON * const item, parse_buffer * const input_buffer)
{
    const unsigned char *input_pointer = buffer_at_offset(input_buffer) + 1;
    const unsigned char *input_end = buffer_at_offset(input_buffer) + 1;
    unsigned char *output_pointer = NULL;
    unsigned char *output = NULL;

    /* not a string */
    if (buffer_at_offset(input_buffer)[0] != '\"')
    {
        goto fail;
    }

    {
        /* calculate approximate size of the output (overestimate) */
        size_t allocation_length = 0;
        size_t skipped_bytes = 0;
        while (((size_t)(input_end - input_buffer->content) < input_buffer->length) && (*input_end != '\"'))
        {
            /* is escape sequence */
            if (input_end[0] == '\\')
            {
                if ((size_t)(input_end + 1 - input_buffer->content) >= input_buffer->length)
                {
                    /* prevent buffer overflow when last input character is a backslash */
                    goto fail;
                }
                skipped_bytes++;
                input_end++;
            }
            input_end++;
        }
        if (((size_t)(input_end - input_buffer->content) >= input_buffer->length) || (*input_end != '\"'))
        {
            goto fail; /* string ended unexpectedly */
        }

        /* This is at most how much we need for the output */
        allocation_length = (size_t) (input_end - buffer_at_offset(input_buffer)) - skipped_bytes;
        output = (unsigned char*)input_buffer->hooks.allocate(allocation_length + sizeof(""));
        if (output == NULL)
        {
            goto fail; /* allocation failure */
        }
    }

    output_pointer = output;
    /* loop through the string literal */
    while (input_pointer < input_end)
    {
        if (*input_pointer != '\\')
        {
            *output_pointer++ = *input_pointer++;
        }
        /* escape sequence */
        else
        {
            unsigned char sequence_length = 2;
            if ((input_end - input_pointer) < 1)
            {
                goto fail;
            }

            switch (input_pointer[1])
            {
                case 'b':
                    *output_pointer++ = '\b';
                    break;
                case 'f':
                    *output_pointer++ = '\f';
                    break;
                case 'n':
                    *output_pointer++ = '\n';
                    break;
                case 'r':
                    *output_pointer++ = '\r';
                    break;
                case 't':
                    *output_pointer++ = '\t';
                    break;
                case '\"':
                case '\\':
                case '/':
                    *output_pointer++ = input_pointer[1];
                    break;

                /* UTF-16 literal */
                case 'u':
                    sequence_length = utf16_literal_to_utf8(input_pointer, input_end, &output_pointer);
                    if (sequence_length == 0)
                    {
                        /* failed to convert UTF16-literal to UTF-8 */
                        goto fail;
                    }
                    break;

                default:
                    goto fail;
            }
            input_pointer += sequence_length;
        }
    }

    /* zero terminate the output */
    *output_pointer = '\0';

    item->type = cJSON_String;
    item->valuestring = (char*)output;

    input_buffer->offset = (size_t) (input_end - input_buffer->content);
    input_buffer->offset++;

    return true;

fail:
    if (output != NULL)
    {
        input_buffer->hooks.deallocate(output);
        output = NULL;
    }

    if (input_pointer != NULL)
    {
        input_buffer->offset = (size_t)(input_pointer - input_buffer->content);
    }

    return false;
}